

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O3

void ConstructTtPath::Finish(json *quadContour)

{
  size_type idx;
  int iVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  size_t sVar6;
  double dVar7;
  double dVar8;
  bool ret;
  Point p3;
  Point p2;
  Point p1;
  boolean_t local_79;
  Point local_78;
  Point local_68;
  Point local_58;
  Point local_48;
  Point local_38;
  
  if (quadContour->m_type == object) {
    sVar6 = (((quadContour->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    if (quadContour->m_type != array) {
      return;
    }
    sVar6 = (long)(((quadContour->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(((quadContour->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4;
  }
  if (1 < sVar6) {
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](quadContour,0);
    Point::Point(&local_38,pvVar4);
    idx = sVar6 - 1;
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](quadContour,idx);
    Point::Point(&local_48,pvVar4);
    if (SQRT((local_38.x - local_48.x) * (local_38.x - local_48.x) +
             (local_38.y - local_48.y) * (local_38.y - local_48.y)) < 1.0) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::erase(quadContour,idx);
      sVar6 = idx;
    }
    if (2 < sVar6) {
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](quadContour,1);
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar4,"on");
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](quadContour,sVar6 - 1);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar5,"on");
      bVar2 = nlohmann::operator==(pvVar4,pvVar5);
      if (bVar2) {
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](quadContour,1);
        Point::Point(&local_58,pvVar4);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](quadContour,0);
        Point::Point(&local_68,pvVar4);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](quadContour,sVar6 - 1);
        Point::Point(&local_78,pvVar4);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](quadContour,1);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar4,"on");
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  (pvVar4,&local_79);
        if (local_79 == true) {
          dVar7 = local_78.y - local_58.y;
          dVar8 = local_58.x - local_78.x;
          iVar3 = (int)(local_68.x * dVar7 + local_68.y * dVar8 +
                       local_78.x * local_58.y + -local_58.x * local_78.y);
          iVar1 = -iVar3;
          if (0 < iVar3) {
            iVar1 = iVar3;
          }
          dVar7 = (double)iVar1 / SQRT(dVar7 * dVar7 + dVar8 * dVar8);
        }
        else {
          local_68.x = (local_58.x + local_78.x) * 0.5 - local_68.x;
          local_68.y = (local_58.y + local_78.y) * 0.5 - local_68.y;
          dVar7 = SQRT(local_68.x * local_68.x + local_68.y * local_68.y);
        }
        if (dVar7 < 1.0) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::erase(quadContour,0);
        }
      }
    }
  }
  return;
}

Assistant:

void Finish(json &quadContour)
{
	size_t length = quadContour.size();
	// quadContour[0] and quadContour[-1] are implicitly on-curve
	if (length >= 2 && abs(Point(quadContour[0]) - quadContour[length - 1]) < 1)
	{
		quadContour.erase(length - 1);
		length--;
	}
	if (length <= 2)
		return;
	if (quadContour[1]["on"] != quadContour[length - 1]["on"])
		// first point is tangent point, do nothing
		return;
	Point p1 = quadContour[1];
	Point p2 = quadContour[0];
	Point p3 = quadContour[length - 1];
	if (quadContour[1]["on"])
	{
		// 2 lines, merge if the are collinear.
		double a = p3.y - p1.y;
		double b = p1.x - p3.x;
		double c = p1.y * p3.x - p1.x * p3.y;
		double distance = abs(a * p2.x + b * p2.y + c) / sqrt(a * a + b * b);
		if (distance < 1)
			quadContour.erase(0);
	}
	else if (abs((p1 + p3) / 2 - p2) < 1)
		// 2 curves, remove on-curve point if it is the center point
		quadContour.erase(0);
}